

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Writer::DestructorClose(BP5Writer *this,bool Verbose)

{
  ostream *poVar1;
  byte in_SIL;
  long in_RDI;
  BP5Writer *unaff_retaddr;
  long lVar2;
  
  lVar2 = in_RDI;
  if ((in_SIL & 1) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"BP5 Writer \"");
    poVar1 = std::operator<<(poVar1,(string *)(in_RDI + 0x30));
    poVar1 = std::operator<<(poVar1,"\" Destroyed without a prior Close().");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cerr,"This may result in corrupt output.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  UpdateActiveFlag(unaff_retaddr,SUB81((ulong)lVar2 >> 0x38,0));
  *(undefined1 *)(in_RDI + 0x80) = 0;
  return;
}

Assistant:

void BP5Writer::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "BP5 Writer \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in corrupt output." << std::endl;
    }
    // close metadata index file
    UpdateActiveFlag(false);
    m_IsOpen = false;
}